

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllTypes.cpp
# Opt level: O1

void __thiscall
slang::ast::ForwardingTypedefSymbol::checkType
          (ForwardingTypedefSymbol *this,ForwardTypedefCategory checkCategory,
          Visibility checkVisibility,SourceLocation declLoc)

{
  Diagnostic *this_00;
  logic_error *this_01;
  long *plVar1;
  size_type *psVar2;
  long *plVar3;
  char *pcVar4;
  size_t sVar5;
  string_view arg;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  while (((this->category == checkCategory || (checkCategory == None)) || (this->category == None)))
  {
    if (((this->visibility).super__Optional_base<slang::ast::Visibility,_true,_true>._M_payload.
         super__Optional_payload_base<slang::ast::Visibility>._M_engaged == true) &&
       ((this->visibility).super__Optional_base<slang::ast::Visibility,_true,_true>._M_payload.
        super__Optional_payload_base<slang::ast::Visibility>._M_payload._M_value != checkVisibility)
       ) {
      this_00 = Scope::addDiag((this->super_Symbol).parentScope,(DiagCode)0xa0009,
                               (this->super_Symbol).location);
      goto LAB_001eb9da;
    }
    this = this->next;
    if (this == (ForwardingTypedefSymbol *)0x0) {
      return;
    }
  }
  this_00 = Scope::addDiag((this->super_Symbol).parentScope,(DiagCode)0x90009,
                           (this->super_Symbol).location);
  switch(this->category) {
  case Enum:
    pcVar4 = "enum";
    sVar5 = 4;
    break;
  case Struct:
    pcVar4 = "struct";
    sVar5 = 6;
    break;
  case Union:
    pcVar4 = "union";
    goto LAB_001eb9bc;
  case Class:
    pcVar4 = "class";
LAB_001eb9bc:
    sVar5 = 5;
    break;
  case InterfaceClass:
    pcVar4 = "interface class";
    sVar5 = 0xf;
    break;
  default:
    this_01 = (logic_error *)__cxa_allocate_exception(0x10);
    local_90[0] = local_80;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_90,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/types/AllTypes.cpp"
               ,"");
    plVar1 = (long *)std::__cxx11::string::append((char *)local_90);
    local_d0._M_dataplus._M_p = (pointer)*plVar1;
    psVar2 = (size_type *)(plVar1 + 2);
    if ((size_type *)local_d0._M_dataplus._M_p == psVar2) {
      local_d0.field_2._M_allocated_capacity = *psVar2;
      local_d0.field_2._8_8_ = plVar1[3];
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    }
    else {
      local_d0.field_2._M_allocated_capacity = *psVar2;
    }
    local_d0._M_string_length = plVar1[1];
    *plVar1 = (long)psVar2;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    std::__cxx11::to_string(&local_70,0x482);
    std::operator+(&local_50,&local_d0,&local_70);
    plVar1 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_b0 = (long *)*plVar1;
    plVar3 = plVar1 + 2;
    if (local_b0 == plVar3) {
      local_a0 = *plVar3;
      lStack_98 = plVar1[3];
      local_b0 = &local_a0;
    }
    else {
      local_a0 = *plVar3;
    }
    local_a8 = plVar1[1];
    *plVar1 = (long)plVar3;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    plVar1 = (long *)std::__cxx11::string::append((char *)&local_b0);
    local_f0 = (long *)*plVar1;
    plVar3 = plVar1 + 2;
    if (local_f0 == plVar3) {
      local_e0 = *plVar3;
      lStack_d8 = plVar1[3];
      local_f0 = &local_e0;
    }
    else {
      local_e0 = *plVar3;
    }
    local_e8 = plVar1[1];
    *plVar1 = (long)plVar3;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    std::logic_error::logic_error(this_01,(string *)&local_f0);
    __cxa_throw(this_01,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  arg._M_str = pcVar4;
  arg._M_len = sVar5;
  Diagnostic::operator<<(this_00,arg);
LAB_001eb9da:
  Diagnostic::addNote(this_00,(DiagCode)0x40001,declLoc);
  return;
}

Assistant:

void ForwardingTypedefSymbol::checkType(ForwardTypedefCategory checkCategory,
                                        Visibility checkVisibility, SourceLocation declLoc) const {
    if (category != ForwardTypedefCategory::None && checkCategory != ForwardTypedefCategory::None &&
        category != checkCategory) {
        auto& diag = getParentScope()->addDiag(diag::ForwardTypedefDoesNotMatch, location);
        switch (category) {
            case ForwardTypedefCategory::Enum:
                diag << "enum"sv;
                break;
            case ForwardTypedefCategory::Struct:
                diag << "struct"sv;
                break;
            case ForwardTypedefCategory::Union:
                diag << "union"sv;
                break;
            case ForwardTypedefCategory::Class:
                diag << "class"sv;
                break;
            case ForwardTypedefCategory::InterfaceClass:
                diag << "interface class"sv;
                break;
            default:
                ASSUME_UNREACHABLE;
        }
        diag.addNote(diag::NoteDeclarationHere, declLoc);
        return;
    }

    if (visibility && visibility != checkVisibility) {
        auto& diag = getParentScope()->addDiag(diag::ForwardTypedefVisibility, location);
        diag.addNote(diag::NoteDeclarationHere, declLoc);
        return;
    }

    if (next)
        next->checkType(checkCategory, checkVisibility, declLoc);
}